

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O3

ReconciliationRegisterResult __thiscall
TxReconciliationTracker::Impl::RegisterPeer
          (Impl *this,NodeId peer_id,bool is_peer_inbound,uint32_t peer_recon_version,
          uint64_t remote_salt)

{
  variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *__v;
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  string_view source_file;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  Logger *pLVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  undefined8 *puVar12;
  CSHA256 *pCVar13;
  bool *args_1;
  ReconciliationRegisterResult RVar14;
  TxReconciliationState *__storage;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  uint256 full_salt;
  string log_msg;
  byte local_149;
  NodeId local_148 [2];
  unique_lock<std::mutex> local_138 [5];
  ulong local_e8 [4];
  string local_c8;
  undefined1 local_a0 [104];
  long local_38;
  
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138[0]._M_owns = false;
  args_1 = (bool *)remote_salt;
  local_149 = is_peer_inbound;
  local_148[0] = peer_id;
  local_138[0]._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(local_138);
  uVar1 = (this->m_states)._M_h._M_bucket_count;
  uVar10 = (ulong)peer_id % uVar1;
  p_Var2 = (this->m_states)._M_h._M_buckets[uVar10];
  if (p_Var2 == (__node_base_ptr)0x0) {
LAB_0097b5be:
    RVar14 = NOT_FOUND;
  }
  else {
    p_Var3 = p_Var2->_M_nxt;
    p_Var4 = p_Var3[1]._M_nxt;
    do {
      if (p_Var4 == (_Hash_node_base *)peer_id) {
        RVar14 = ALREADY_REGISTERED;
        if (*(char *)&p_Var3[5]._M_nxt != '\x01') {
          if (this->m_recon_version < peer_recon_version) {
            peer_recon_version = this->m_recon_version;
          }
          if (peer_recon_version == 0) {
            RVar14 = PROTOCOL_VIOLATION;
          }
          else {
            __v = (variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState> *)
                  (p_Var3 + 2);
            uVar1 = *(ulong *)&(__v->
                               super__Variant_base<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               ).
                               super__Move_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               .
                               super__Copy_assign_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               .
                               super__Move_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               .
                               super__Copy_ctor_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               .
                               super__Variant_storage_alias<unsigned_long,_(anonymous_namespace)::TxReconciliationState>
                               ._M_u;
            pLVar8 = LogInstance();
            bVar7 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TXRECONCILIATION,Debug);
            if (bVar7) {
              pLVar8 = LogInstance();
              bVar7 = BCLog::Logger::Enabled(pLVar8);
              if (bVar7) {
                local_a0._8_8_ = 0;
                local_a0[0x10] = '\0';
                local_a0._0_8_ = local_a0 + 0x10;
                tinyformat::format<long,bool>
                          (&local_c8,(tinyformat *)"Register peer=%d (inbound=%i)\n",
                           (char *)local_148,(long *)&local_149,args_1);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a0,&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
                pLVar8 = LogInstance();
                local_c8._M_dataplus._M_p = (pointer)0x62;
                local_c8._M_string_length = 0xfbf224;
                source_file._M_str =
                     "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/txreconciliation.cpp"
                ;
                source_file._M_len = 0x62;
                str._M_str = (char *)local_a0._0_8_;
                str._M_len = local_a0._8_8_;
                logging_function._M_str = "RegisterPeer";
                logging_function._M_len = 0xc;
                BCLog::Logger::LogPrintStr
                          (pLVar8,str,logging_function,source_file,0x79,TXRECONCILIATION,Debug);
                if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
                  operator_delete((void *)local_a0._0_8_,
                                  CONCAT71(local_a0._17_7_,local_a0[0x10]) + 1);
                }
              }
            }
            puVar12 = &(anonymous_namespace)::RECON_SALT_HASHER;
            pCVar13 = (CSHA256 *)local_a0;
            for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
              *(undefined8 *)pCVar13->s = *puVar12;
              puVar12 = puVar12 + (ulong)bVar11 * -2 + 1;
              pCVar13 = (CSHA256 *)((long)pCVar13 + (ulong)bVar11 * -0x10 + 8);
            }
            local_e8[0] = uVar1;
            if (remote_salt < uVar1) {
              local_e8[0] = remote_salt;
            }
            CSHA256::Write((CSHA256 *)local_a0,(uchar *)local_e8,8);
            local_e8[0] = remote_salt;
            if (remote_salt < uVar1) {
              local_e8[0] = uVar1;
            }
            CSHA256::Write((CSHA256 *)local_a0,(uchar *)local_e8,8);
            local_c8._M_dataplus._M_p = (pointer)0x0;
            local_c8._M_string_length = 0;
            local_c8.field_2._M_allocated_capacity = 0;
            local_c8.field_2._8_8_ = 0;
            CSHA256::Finalize((CSHA256 *)local_a0,(uchar *)&local_c8);
            sVar6 = local_c8._M_string_length;
            _Var5._M_p = local_c8._M_dataplus._M_p;
            bVar11 = local_149 ^ 1;
            if (*(char *)&p_Var3[5]._M_nxt == '\x01') {
              std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
              *(byte *)&p_Var3[2]._M_nxt = bVar11;
              p_Var3[3]._M_nxt = (_Hash_node_base *)_Var5._M_p;
              p_Var3[4]._M_nxt = (_Hash_node_base *)sVar6;
            }
            else {
              *(byte *)&p_Var3[2]._M_nxt = bVar11;
              p_Var3[3]._M_nxt = (_Hash_node_base *)local_c8._M_dataplus._M_p;
              p_Var3[4]._M_nxt = (_Hash_node_base *)local_c8._M_string_length;
              *(undefined1 *)&p_Var3[5]._M_nxt = 1;
              std::get<1ul,unsigned_long,(anonymous_namespace)::TxReconciliationState>(__v);
            }
            RVar14 = SUCCESS;
          }
        }
        break;
      }
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (_Hash_node_base *)0x0) goto LAB_0097b5be;
      p_Var4 = p_Var3[1]._M_nxt;
      RVar14 = NOT_FOUND;
    } while ((ulong)p_Var4 % uVar1 == uVar10);
  }
  std::unique_lock<std::mutex>::~unique_lock(local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return RVar14;
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);
        auto recon_state = m_states.find(peer_id);

        if (recon_state == m_states.end()) return ReconciliationRegisterResult::NOT_FOUND;

        if (std::holds_alternative<TxReconciliationState>(recon_state->second)) {
            return ReconciliationRegisterResult::ALREADY_REGISTERED;
        }

        uint64_t local_salt = *std::get_if<uint64_t>(&recon_state->second);

        // If the peer supports the version which is lower than ours, we downgrade to the version
        // it supports. For now, this only guarantees that nodes with future reconciliation
        // versions have the choice of reconciling with this current version. However, they also
        // have the choice to refuse supporting reconciliations if the common version is not
        // satisfactory (e.g. too low).
        const uint32_t recon_version{std::min(peer_recon_version, m_recon_version)};
        // v1 is the lowest version, so suggesting something below must be a protocol violation.
        if (recon_version < 1) return ReconciliationRegisterResult::PROTOCOL_VIOLATION;

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Register peer=%d (inbound=%i)\n",
                      peer_id, is_peer_inbound);

        const uint256 full_salt{ComputeSalt(local_salt, remote_salt)};
        recon_state->second = TxReconciliationState(!is_peer_inbound, full_salt.GetUint64(0), full_salt.GetUint64(1));
        return ReconciliationRegisterResult::SUCCESS;
    }